

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLRNLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  LRNLayerParams *pLVar2;
  allocator local_81;
  undefined1 local_80 [40];
  string err;
  string local_38;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_80,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_80,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string((string *)&local_38,"LRNLayer",(allocator *)&err);
    validateInputOutputRankEquality((Result *)local_80,layer,&local_38,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&err,"LRNLayer",&local_81);
    validateRankCount((Result *)local_80,layer,&err,3,-1,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&err);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  pLVar2 = Specification::NeuralNetworkLayer::lrn(layer);
  if (pLVar2->k_ <= 0.0 && pLVar2->k_ != 0.0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "Parameter \'K\' for the LRN layer \'",(layer->name_).ptr_);
    std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80,"\' must be positive.");
    std::__cxx11::string::~string((string *)local_80);
    Result::Result((Result *)local_80,INVALID_MODEL_PARAMETERS,&err);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&err);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLRNLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "LRNLayer", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "LRNLayer", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    if (layer.lrn().k() < 0.0) {
        std::string err = "Parameter 'K' for the LRN layer '" + layer.name() + "' must be positive.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}